

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::VertexAttributePointerCase::test
          (VertexAttributePointerCase *this)

{
  TestContext *pTVar1;
  void **ppvVar2;
  undefined1 local_148 [8];
  StateQueryMemoryWriteGuard<void_*> state;
  GLint local_128;
  int ndx;
  PointerData pointers [10];
  GLfloat vertexData [4];
  StateQueryMemoryWriteGuard<void_*> initialState;
  VertexAttributePointerCase *this_local;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<void_*> *)(vertexData + 2));
  ppvVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::operator&
                      ((StateQueryMemoryWriteGuard<void_*> *)(vertexData + 2));
  glu::CallLogWrapper::glGetVertexAttribPointerv
            (&(this->super_ApiCase).super_CallLogWrapper,0,0x8645,ppvVar2);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::verifyValidity
            ((StateQueryMemoryWriteGuard<void_*> *)(vertexData + 2),
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  ppvVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_void__
                      ((StateQueryMemoryWriteGuard *)(vertexData + 2));
  checkPointerEquals(pTVar1,*ppvVar2,(void *)0x0);
  memset(&pointers[9].pointer,0,0x10);
  local_128 = 1;
  ndx = 0x1400;
  pointers[0].size = 0;
  pointers[0].type._0_1_ = 0;
  pointers[0]._8_8_ = vertexData;
  pointers[0].pointer._0_4_ = 1;
  pointers[0].pointer._4_4_ = 0x1402;
  pointers[1].size = 0;
  pointers[1].type._0_1_ = 0;
  pointers[1]._8_8_ = (undefined1 *)((long)&pointers[9].pointer + 4);
  pointers[1].pointer._0_4_ = 1;
  pointers[1].pointer._4_4_ = 0x140c;
  pointers[2].size = 0;
  pointers[2].type._0_1_ = 0;
  pointers[2]._8_8_ = vertexData;
  pointers[2].pointer._0_4_ = 1;
  pointers[2].pointer._4_4_ = 0x140c;
  pointers[3].size = 0;
  pointers[3].type._0_1_ = 0;
  pointers[3]._8_8_ = (undefined1 *)((long)&pointers[9].pointer + 4);
  pointers[3].pointer._0_4_ = 1;
  pointers[3].pointer._4_4_ = 0x1406;
  pointers[4].size = 0;
  pointers[4].type._0_1_ = 0;
  pointers[4]._8_8_ = &pointers[9].pointer;
  pointers[4].pointer._0_4_ = 1;
  pointers[4].pointer._4_4_ = 0x1406;
  pointers[5].size = 0;
  pointers[5].type._0_1_ = 0;
  pointers[5]._8_8_ = vertexData + 1;
  pointers[5].pointer._0_4_ = 1;
  pointers[5].pointer._4_4_ = 0x1406;
  pointers[6].size = 0;
  pointers[6].type._0_1_ = 0;
  pointers[6]._8_8_ = vertexData;
  pointers[6].pointer._0_4_ = 1;
  pointers[6].pointer._4_4_ = 0x1403;
  pointers[7].size = 0;
  pointers[7].type._0_1_ = 0;
  pointers[7]._8_8_ = &pointers[9].pointer;
  pointers[7].pointer._0_4_ = 4;
  pointers[7].pointer._4_4_ = 0x1403;
  pointers[8].size = 0;
  pointers[8].type._0_1_ = 0;
  pointers[8]._8_8_ = (undefined1 *)((long)&pointers[9].pointer + 4);
  pointers[8].pointer._0_4_ = 4;
  pointers[8].pointer._4_4_ = 0x1403;
  pointers[9].size = 0;
  pointers[9].type._0_1_ = 0;
  pointers[9]._8_8_ = vertexData;
  for (state.m_postguard._4_4_ = 0; state.m_postguard._4_4_ < 10;
      state.m_postguard._4_4_ = state.m_postguard._4_4_ + 1) {
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_ApiCase).super_CallLogWrapper,0,
               (&local_128)[(long)state.m_postguard._4_4_ * 6],
               *(GLenum *)((long)&pointers[(long)state.m_postguard._4_4_ + -1].pointer + 4),
               (GLboolean)pointers[state.m_postguard._4_4_].type,
               pointers[state.m_postguard._4_4_].size,
               *(void **)&pointers[state.m_postguard._4_4_].stride);
    ApiCase::expectError(&this->super_ApiCase,0);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<void_*> *)local_148);
    ppvVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::operator&
                        ((StateQueryMemoryWriteGuard<void_*> *)local_148);
    glu::CallLogWrapper::glGetVertexAttribPointerv
              (&(this->super_ApiCase).super_CallLogWrapper,0,0x8645,ppvVar2);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::verifyValidity
              ((StateQueryMemoryWriteGuard<void_*> *)local_148,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    ppvVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_void__
                        ((StateQueryMemoryWriteGuard *)local_148);
    checkPointerEquals(pTVar1,*ppvVar2,*(void **)&pointers[state.m_postguard._4_4_].stride);
  }
  return;
}

Assistant:

void test (void)
	{
		StateQueryMemoryWriteGuard<GLvoid*> initialState;
		glGetVertexAttribPointerv(0, GL_VERTEX_ATTRIB_ARRAY_POINTER, &initialState);
		initialState.verifyValidity(m_testCtx);
		checkPointerEquals(m_testCtx, initialState, 0);

		GLfloat vertexData[4] = {0.0f}; // never accessed
		const PointerData pointers[] =
		{
			{ 1, GL_BYTE,				0,	GL_FALSE, &vertexData[2] },
			{ 1, GL_SHORT,				0,	GL_FALSE, &vertexData[1] },
			{ 1, GL_FIXED,				0,	GL_FALSE, &vertexData[2] },
			{ 1, GL_FIXED,				0,	GL_FALSE, &vertexData[1] },
			{ 1, GL_FLOAT,				0,	GL_FALSE, &vertexData[0] },
			{ 1, GL_FLOAT,				0,	GL_FALSE, &vertexData[3] },
			{ 1, GL_FLOAT,				0,	GL_FALSE, &vertexData[2] },
			{ 1, GL_UNSIGNED_SHORT,		0,	GL_FALSE, &vertexData[0] },
			{ 4, GL_UNSIGNED_SHORT,		0,	GL_FALSE, &vertexData[1] },
			{ 4, GL_UNSIGNED_SHORT,		0,	GL_FALSE, &vertexData[2] },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
		{
			glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].normalized, pointers[ndx].stride, pointers[ndx].pointer);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLvoid*> state;
			glGetVertexAttribPointerv(0, GL_VERTEX_ATTRIB_ARRAY_POINTER, &state);
			state.verifyValidity(m_testCtx);
			checkPointerEquals(m_testCtx, state, pointers[ndx].pointer);
		}
	}